

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_173::FunctionOptimizer::FunctionOptimizer
          (FunctionOptimizer *this,PCVStructValuesMap *propagatedInfos,SubTypes *subTypes,
          PCVStructValuesMap *rawNewInfos,bool refTest)

{
  bool refTest_local;
  PCVStructValuesMap *rawNewInfos_local;
  SubTypes *subTypes_local;
  PCVStructValuesMap *propagatedInfos_local;
  FunctionOptimizer *this_local;
  
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
  ::WalkerPass(&this->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
              );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__FunctionOptimizer_0309aa20;
  this->propagatedInfos = propagatedInfos;
  this->subTypes = subTypes;
  this->rawNewInfos = rawNewInfos;
  this->refTest = refTest;
  this->changed = false;
  return;
}

Assistant:

FunctionOptimizer(const PCVStructValuesMap& propagatedInfos,
                    const SubTypes& subTypes,
                    const PCVStructValuesMap& rawNewInfos,
                    bool refTest)
    : propagatedInfos(propagatedInfos), subTypes(subTypes),
      rawNewInfos(rawNewInfos), refTest(refTest) {}